

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
xemmai::t_parser::f_expressions
          (t_parser *this,size_t a_indent,
          vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
          *a_nodes)

{
  undefined8 uVar1;
  bool bVar2;
  t_token tVar3;
  vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
  *pvVar4;
  undefined1 local_48 [24];
  undefined1 local_30 [16];
  vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
  *a_nodes_local;
  size_t a_indent_local;
  t_parser *this_local;
  
  local_30._8_8_ = a_nodes;
  a_nodes_local =
       (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
        *)a_indent;
  a_indent_local = (size_t)this;
  while( true ) {
    while( true ) {
      tVar3 = t_lexer::f_token(&this->v_lexer);
      uVar1 = local_30._8_8_;
      if (tVar3 == c_token__ASTERISK) {
        t_lexer::f_next(&this->v_lexer);
        uVar1 = local_30._8_8_;
        f_expression((t_parser *)local_48);
        std::
        vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
        ::push_back((vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                     *)uVar1,(value_type *)local_48);
        std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
                  ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                   local_48);
        return true;
      }
      f_expression((t_parser *)local_30);
      std::
      vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
      ::push_back((vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                   *)uVar1,(value_type *)local_30);
      std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
                ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                 local_30);
      tVar3 = t_lexer::f_token(&this->v_lexer);
      if (tVar3 == c_token__COMMA) break;
      bVar2 = t_lexer::f_newline(&this->v_lexer);
      if ((!bVar2) ||
         (pvVar4 = (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                    *)t_lexer::f_indent(&this->v_lexer), pvVar4 <= a_nodes_local)) {
        return false;
      }
    }
    bVar2 = t_lexer::f_newline(&this->v_lexer);
    if ((bVar2) &&
       (pvVar4 = (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                  *)t_lexer::f_indent(&this->v_lexer), pvVar4 < a_nodes_local)) break;
    t_lexer::f_next(&this->v_lexer);
  }
  return false;
}

Assistant:

bool t_parser::f_expressions(size_t a_indent, std::vector<std::unique_ptr<ast::t_node>>& a_nodes)
{
	while (v_lexer.f_token() != t_lexer::c_token__ASTERISK) {
		a_nodes.push_back(f_expression());
		if (v_lexer.f_token() == t_lexer::c_token__COMMA) {
			if (v_lexer.f_newline() && v_lexer.f_indent() < a_indent) return false;
			v_lexer.f_next();
			continue;
		}
		if (!v_lexer.f_newline() || v_lexer.f_indent() <= a_indent) return false;
	}
	v_lexer.f_next();
	a_nodes.push_back(f_expression());
	return true;
}